

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exomizer.h
# Opt level: O1

void membuf_delete(membuf **sbp)

{
  membuf *__ptr;
  
  __ptr = *sbp;
  if (__ptr->buf != (void *)0x0) {
    free(__ptr->buf);
    __ptr->buf = (void *)0x0;
  }
  __ptr->len = 0;
  __ptr->size = 0;
  free(__ptr);
  *sbp = (membuf *)0x0;
  return;
}

Assistant:

void membuf_delete(struct membuf **sbp)
{
    struct membuf *sb;

    sb = *sbp;
    membuf_free(sb);
    free(sb);
    sb = NULL;
    *sbp = sb;
}